

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

int setContext(XML_Parser parser,XML_Char *context)

{
  XML_Char XVar1;
  undefined1 uVar2;
  undefined1 *puVar3;
  int iVar4;
  NAMED *pNVar5;
  XML_Char *pXVar6;
  bool bVar7;
  PREFIX *local_38;
  PREFIX *prefix;
  ENTITY *e;
  XML_Char *s;
  XML_Char *context_local;
  XML_Parser parser_local;
  
  e = (ENTITY *)context;
  s = context;
  while( true ) {
    while( true ) {
      if (*s == '\0') {
        return 1;
      }
      if ((*(char *)&e->name == '\f') || (*(char *)&e->name == '\0')) break;
      if (*(char *)&e->name == '=') {
        if (*(long *)((long)parser + 0x430) == *(long *)((long)parser + 0x438)) {
          local_38 = (PREFIX *)((long)parser + 0x390);
        }
        else {
          if ((*(long *)((long)parser + 0x430) == *(long *)((long)parser + 0x428)) &&
             (iVar4 = poolGrow((STRING_POOL *)((long)parser + 0x418)), iVar4 == 0)) {
            return 0;
          }
          puVar3 = *(undefined1 **)((long)parser + 0x430);
          *(undefined1 **)((long)parser + 0x430) = puVar3 + 1;
          *puVar3 = 0;
          local_38 = (PREFIX *)
                     lookup((HASH_TABLE *)((long)parser + 0x308),*(KEY *)((long)parser + 0x438),0x10
                           );
          if (local_38 == (PREFIX *)0x0) {
            return 0;
          }
          if (local_38->name == *(KEY *)((long)parser + 0x438)) {
            pXVar6 = poolCopyString((STRING_POOL *)((long)parser + 0x330),local_38->name);
            local_38->name = pXVar6;
            if (local_38->name == (KEY)0x0) {
              return 0;
            }
          }
          *(undefined8 *)((long)parser + 0x430) = *(undefined8 *)((long)parser + 0x438);
        }
        while( true ) {
          s = (XML_Char *)((long)&e->name + 1);
          bVar7 = false;
          if (*s != '\f') {
            bVar7 = *s != '\0';
          }
          if (!bVar7) break;
          if ((*(long *)((long)parser + 0x430) == *(long *)((long)parser + 0x428)) &&
             (iVar4 = poolGrow((STRING_POOL *)((long)parser + 0x418)), iVar4 == 0)) {
            return 0;
          }
          XVar1 = *s;
          pXVar6 = *(XML_Char **)((long)parser + 0x430);
          *(XML_Char **)((long)parser + 0x430) = pXVar6 + 1;
          *pXVar6 = XVar1;
          e = (ENTITY *)s;
        }
        if ((*(long *)((long)parser + 0x430) == *(long *)((long)parser + 0x428)) &&
           (iVar4 = poolGrow((STRING_POOL *)((long)parser + 0x418)), iVar4 == 0)) {
          return 0;
        }
        puVar3 = *(undefined1 **)((long)parser + 0x430);
        *(undefined1 **)((long)parser + 0x430) = puVar3 + 1;
        *puVar3 = 0;
        iVar4 = addBinding(parser,local_38,(ATTRIBUTE_ID *)0x0,*(XML_Char **)((long)parser + 0x438),
                           (BINDING **)((long)parser + 0x3e0));
        if (iVar4 == 0) {
          return 0;
        }
        *(undefined8 *)((long)parser + 0x430) = *(undefined8 *)((long)parser + 0x438);
        if (*s != '\0') {
          s = (XML_Char *)((long)&e->name + 2);
        }
        e = (ENTITY *)s;
      }
      else {
        if ((*(long *)((long)parser + 0x430) == *(long *)((long)parser + 0x428)) &&
           (iVar4 = poolGrow((STRING_POOL *)((long)parser + 0x418)), iVar4 == 0)) {
          return 0;
        }
        uVar2 = *(undefined1 *)&e->name;
        puVar3 = *(undefined1 **)((long)parser + 0x430);
        *(undefined1 **)((long)parser + 0x430) = puVar3 + 1;
        *puVar3 = uVar2;
        e = (ENTITY *)((long)&e->name + 1);
      }
    }
    if ((*(long *)((long)parser + 0x430) == *(long *)((long)parser + 0x428)) &&
       (iVar4 = poolGrow((STRING_POOL *)((long)parser + 0x418)), iVar4 == 0)) break;
    puVar3 = *(undefined1 **)((long)parser + 0x430);
    *(undefined1 **)((long)parser + 0x430) = puVar3 + 1;
    *puVar3 = 0;
    pNVar5 = lookup((HASH_TABLE *)((long)parser + 0x290),*(KEY *)((long)parser + 0x438),0);
    if (pNVar5 != (NAMED *)0x0) {
      *(undefined1 *)&pNVar5[7].name = 1;
    }
    if (*(char *)&e->name != '\0') {
      e = (ENTITY *)((long)&e->name + 1);
    }
    s = (XML_Char *)e;
    *(undefined8 *)((long)parser + 0x430) = *(undefined8 *)((long)parser + 0x438);
  }
  return 0;
}

Assistant:

static
int setContext(XML_Parser parser, const XML_Char *context)
{
  const XML_Char *s = context;

  while (*context != XML_T('\0')) {
    if (*s == CONTEXT_SEP || *s == XML_T('\0')) {
      ENTITY *e;
      if (!poolAppendChar(&tempPool, XML_T('\0')))
        return 0;
      e = (ENTITY *)lookup(&dtd.generalEntities, poolStart(&tempPool), 0);
      if (e)
        e->open = 1;
      if (*s != XML_T('\0'))
        s++;
      context = s;
      poolDiscard(&tempPool);
    }
    else if (*s == '=') {
      PREFIX *prefix;
      if (poolLength(&tempPool) == 0)
        prefix = &dtd.defaultPrefix;
      else {
        if (!poolAppendChar(&tempPool, XML_T('\0')))
          return 0;
        prefix = (PREFIX *)lookup(&dtd.prefixes, poolStart(&tempPool), sizeof(PREFIX));
        if (!prefix)
          return 0;
        if (prefix->name == poolStart(&tempPool)) {
          prefix->name = poolCopyString(&dtd.pool, prefix->name);
          if (!prefix->name)
            return 0;
        }
        poolDiscard(&tempPool);
      }
      for (context = s + 1; *context != CONTEXT_SEP && *context != XML_T('\0'); context++)
        if (!poolAppendChar(&tempPool, *context))
          return 0;
      if (!poolAppendChar(&tempPool, XML_T('\0')))
        return 0;
      if (!addBinding(parser, prefix, 0, poolStart(&tempPool), &inheritedBindings))
        return 0;
      poolDiscard(&tempPool);
      if (*context != XML_T('\0'))
        ++context;
      s = context;
    }
    else {
      if (!poolAppendChar(&tempPool, *s))
        return 0;
      s++;
    }
  }
  return 1;
}